

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::expectToken(Reader *this,TokenType type,Token *token,char *message)

{
  char *in_RCX;
  Token *in_RDX;
  TokenType in_ESI;
  Reader *in_RDI;
  Token *in_stack_ffffffffffffff88;
  Reader *in_stack_ffffffffffffff90;
  allocator *paVar1;
  allocator local_49;
  string local_48 [32];
  char *extra;
  undefined4 in_stack_ffffffffffffffe8;
  bool local_1;
  
  readToken(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (in_RDX->type_ == in_ESI) {
    local_1 = true;
  }
  else {
    paVar1 = &local_49;
    extra = in_RCX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,in_RCX,paVar1);
    local_1 = addError(in_RDI,(string *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,extra);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return local_1;
}

Assistant:

bool Reader::expectToken(TokenType type, Token& token, const char* message) {
  readToken(token);
  if (token.type_ != type)
    return addError(message, token);
  return true;
}